

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O2

int ON_SubDComponentAndPoint::ComparePoint
              (ON_SubDComponentAndPoint *lhs,ON_SubDComponentAndPoint *rhs)

{
  int iVar1;
  
  if (lhs == rhs) {
    return 0;
  }
  if (lhs == (ON_SubDComponentAndPoint *)0x0) {
    iVar1 = -1;
  }
  else {
    if (rhs != (ON_SubDComponentAndPoint *)0x0) {
      iVar1 = ON_3dPoint::Compare(&lhs->m_P,&rhs->m_P);
      return iVar1;
    }
    iVar1 = 1;
  }
  return iVar1;
}

Assistant:

int ON_SubDComponentAndPoint::ComparePoint(
  const ON_SubDComponentAndPoint* lhs,
  const ON_SubDComponentAndPoint* rhs
)
{
  if (lhs == rhs)
    return 0;
  if (nullptr == lhs)
    return -1;
  if (nullptr == rhs)
    return 1;
  return ON_3dPoint::Compare(lhs->m_P, rhs->m_P);
}